

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

TEXTURE_FORMAT __thiscall
Diligent::TexFormatToViewFormatConverter::GetViewFormat
          (TexFormatToViewFormatConverter *this,TEXTURE_FORMAT Format,TEXTURE_VIEW_TYPE ViewType,
          Uint32 BindFlags)

{
  wchar16 wVar1;
  undefined7 in_register_00000011;
  byte bVar2;
  uint uVar3;
  string msg;
  string local_50;
  
  uVar3 = (int)CONCAT71(in_register_00000011,ViewType) - 1;
  bVar2 = (byte)uVar3;
  if (5 < bVar2) {
    FormatString<char[29]>(&local_50,(char (*) [29])"Unexpected texture view type");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetViewFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xee);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB < Format) {
    FormatString<char[23]>(&local_50,(char (*) [23])"Unknown texture format");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetViewFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0xef);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((BindFlags & 0x40) == 0 || Format != TEX_FORMAT_R16_TYPELESS) {
    wVar1 = (this->m_ViewFormats)._M_elems[Format]._M_elems
            [(CONCAT71(in_register_00000011,ViewType) & 0xffffffff) - 1];
  }
  else if (bVar2 < 6) {
    wVar1 = L"88778"[uVar3 & 0xff];
  }
  else {
    FormatString<char[29]>(&local_50,(char (*) [29])"Unexpected texture view type");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetViewFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x105);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

TEXTURE_FORMAT GetViewFormat(TEXTURE_FORMAT Format, TEXTURE_VIEW_TYPE ViewType, Uint32 BindFlags)
    {
        VERIFY(ViewType > TEXTURE_VIEW_UNDEFINED && ViewType < TEXTURE_VIEW_NUM_VIEWS, "Unexpected texture view type");
        VERIFY(Format >= TEX_FORMAT_UNKNOWN && Format < TEX_FORMAT_NUM_FORMATS, "Unknown texture format");
        switch (Format)
        {
            case TEX_FORMAT_R16_TYPELESS:
            {
                if (BindFlags & BIND_DEPTH_STENCIL)
                {
                    switch (ViewType)
                    {
                        case TEXTURE_VIEW_SHADER_RESOURCE:
                        case TEXTURE_VIEW_RENDER_TARGET:
                        case TEXTURE_VIEW_UNORDERED_ACCESS:
                            return TEX_FORMAT_R16_UNORM;

                        case TEXTURE_VIEW_DEPTH_STENCIL:
                        case TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL:
                            return TEX_FORMAT_D16_UNORM;

                        case TEXTURE_VIEW_SHADING_RATE:
                            return TEX_FORMAT_UNKNOWN;

                        default:
                            UNEXPECTED("Unexpected texture view type");
                            return TEX_FORMAT_UNKNOWN;
                    }
                    static_assert(TEXTURE_VIEW_NUM_VIEWS == 7, "Please handle the new view type in the switch above, if necessary");
                }
            }

            default: /*do nothing*/ break;
        }

        return m_ViewFormats[Format][ViewType - 1];
    }